

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall Buffer_change_event_coalesce_Test::TestBody(Buffer_change_event_coalesce_Test *this)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  initializer_list<bfy_changed_cb_info> __l;
  allocator_type local_139;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  bfy_changed_cb_info local_110;
  size_t local_f8;
  BufferWithReadonlyStrings local;
  
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local);
  local_f8 = bfy_buffer_get_content_len(&local.buf);
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::start_listening_to_changes(&local);
  bfy_buffer_begin_coalescing_change_events(&local.buf);
  lVar2 = 0x400;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    local_110.orig_size = local_110.orig_size & 0xffffffff00000000;
    gtest_ar_1._0_4_ = bfy_buffer_add_readonly(&local.buf,"Lorem ipsum dolor sit amet",0x1a);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0",
               "bfy_buffer_add_readonly(&local.buf, std::data(str), std::size(str))",
               (int *)&local_110,(int *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_110);
      pcVar1 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                 ,0x656,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      if ((long *)local_110.orig_size != (long *)0x0) {
        (**(code **)(*(long *)local_110.orig_size + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  bfy_buffer_end_coalescing_change_events(&local.buf);
  local_110.orig_size = local_f8;
  local_110.n_added = 0x6800;
  local_110.n_deleted = 0;
  __l._M_len = 1;
  __l._M_array = &local_110;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)&gtest_ar,__l,
             &local_139);
  testing::internal::
  CmpHelperEQ<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>,std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
            ((internal *)&gtest_ar_1,"changes_t{expected}","local.changes",
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)&gtest_ar,
             &local.changes);
  std::_Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::~_Vector_base
            ((_Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x659,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local);
  return;
}

Assistant:

TEST(Buffer, change_event_coalesce) {
    BufferWithReadonlyStrings local;
    auto constexpr str = std::string_view { "Lorem ipsum dolor sit amet" };
    auto constexpr n = 1024;
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = std::size(str) * n,
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    bfy_buffer_begin_coalescing_change_events(&local.buf);
    for (size_t i=0; i<1024; ++i) {
        EXPECT_EQ(0, bfy_buffer_add_readonly(&local.buf, std::data(str), std::size(str)));
    }
    bfy_buffer_end_coalescing_change_events(&local.buf);
    EXPECT_EQ(changes_t{expected}, local.changes);
}